

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  Chunk *pCVar1;
  uint in_ESI;
  Bignum *in_RDI;
  DoubleChunk product;
  int i;
  DoubleChunk carry;
  int local_1c;
  ulong local_18;
  
  if (in_ESI != 1) {
    if (in_ESI == 0) {
      Zero(in_RDI);
    }
    else if (in_RDI->used_bigits_ != 0) {
      local_18 = 0;
      for (local_1c = 0; local_1c < in_RDI->used_bigits_; local_1c = local_1c + 1) {
        pCVar1 = RawBigit(in_RDI,local_1c);
        local_18 = (ulong)in_ESI * (ulong)*pCVar1 + local_18;
        pCVar1 = RawBigit(in_RDI,local_1c);
        *pCVar1 = (uint)local_18 & 0xfffffff;
        local_18 = local_18 >> 0x1c;
      }
      for (; local_18 != 0; local_18 = local_18 >> 0x1c) {
        EnsureCapacity(0);
        pCVar1 = RawBigit(in_RDI,(int)in_RDI->used_bigits_);
        *pCVar1 = (uint)local_18 & 0xfffffff;
        in_RDI->used_bigits_ = in_RDI->used_bigits_ + 1;
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(const uint32_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  DOUBLE_CONVERSION_ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const DoubleChunk product = static_cast<DoubleChunk>(factor) * RawBigit(i) + carry;
    RawBigit(i) = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}